

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readconfig.c
# Opt level: O3

econf_err readConfigWithCallback
                    (econf_file **result,char *config_name,char *config_suffix,char *delim,
                    char *comment,char **conf_dirs,int conf_count,
                    _func__Bool_char_ptr_void_ptr *callback,void *callback_data)

{
  econf_file *peVar1;
  econf_err eVar2;
  econf_file **key_files;
  size_t size;
  
  size = 0;
  key_files = (econf_file **)0x0;
  peVar1 = *result;
  if (peVar1 == (econf_file *)0x0) {
    eVar2 = ECONF_ARGUMENT_IS_NULL_VALUE;
  }
  else {
    if (0 < peVar1->conf_count) {
      conf_dirs = peVar1->conf_dirs;
      conf_count = peVar1->conf_count;
    }
    eVar2 = readConfigHistoryWithCallback
                      (&key_files,&size,peVar1->parse_dirs,peVar1->parse_dirs_count,config_name,
                       config_suffix,delim,comment,peVar1->join_same_entries,peVar1->python_style,
                       conf_dirs,conf_count,callback,callback_data);
    if (eVar2 == ECONF_SUCCESS) {
      if (key_files == (econf_file **)0x0) {
        eVar2 = ECONF_SUCCESS;
      }
      else {
        econf_freeFile(*result);
        *result = (econf_file *)0x0;
        eVar2 = merge_econf_files(key_files,result);
        free(key_files);
      }
    }
  }
  return eVar2;
}

Assistant:

econf_err readConfigWithCallback(econf_file **result,
				 const char *config_name,
				 const char *config_suffix,
				 const char *delim,
				 const char *comment,
				 char **conf_dirs,
				 const int conf_count,
				 bool (*callback)(const char *filename, const void *data),
				 const void *callback_data)
{
  size_t size = 0;
  econf_file **key_files = NULL;
  econf_err error = ECONF_SUCCESS;

  if (*result == NULL)
    return ECONF_ARGUMENT_IS_NULL_VALUE;

  if ((*result)->conf_count > 0) {
    /* Setting defined in econf_file have higher priority */
    error = readConfigHistoryWithCallback(&key_files,
					  &size,
					  (*result)->parse_dirs,
					  (*result)->parse_dirs_count,
					  config_name,
					  config_suffix,
					  delim,
					  comment,
					  (*result)->join_same_entries,
					  (*result)->python_style,
					  (*result)->conf_dirs,
					  (*result)->conf_count,
					  callback,
					  callback_data);
  } else {
    error = readConfigHistoryWithCallback(&key_files,
					  &size,
					  (*result)->parse_dirs,
					  (*result)->parse_dirs_count,
					  config_name,
					  config_suffix,
					  delim,
					  comment,
					  (*result)->join_same_entries,
					  (*result)->python_style,
					  conf_dirs,
					  conf_count,
					  callback,
					  callback_data);
  }

  if (error != ECONF_SUCCESS)
    return error;

  if (key_files) {
    econf_free(*result);
    *result = NULL;
    // Merge the list of acquired key_files into merged_file
    error = merge_econf_files(key_files, result);
    free(key_files);
  }

  return error;
}